

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concur19.cc
# Opt level: O2

void __thiscall
tchecker::tck_reach::concur19::graph_t::attributes
          (graph_t *this,node_t *n,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *m)

{
  refzg_t *this_00;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
  iStack_28;
  
  this_00 = (this->_refzg).super___shared_ptr<tchecker::refzg::refzg_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t(&iStack_28,&(n->super_node_refzg_state_t)._state);
  refzg::refzg_t::attributes(this_00,&iStack_28,m);
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&iStack_28);
  tchecker::graph::attributes(&n->super_node_flags_t,m);
  return;
}

Assistant:

void graph_t::attributes(tchecker::tck_reach::concur19::node_t const & n, std::map<std::string, std::string> & m) const
{
  _refzg->attributes(n.state_ptr(), m);
  tchecker::graph::attributes(static_cast<tchecker::graph::node_flags_t const &>(n), m);
}